

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef
BinaryenMemoryCopy(BinaryenModuleRef module,BinaryenExpressionRef dest,BinaryenExpressionRef source,
                  BinaryenExpressionRef size,char *destMemory,char *sourceMemory)

{
  MemoryCopy *pMVar1;
  Name destMemory_00;
  Name sourceMemory_00;
  Builder local_48;
  BinaryenExpressionRef local_40;
  BinaryenExpressionRef local_38;
  
  local_48.wasm = module;
  local_40 = size;
  local_38 = source;
  destMemory_00 = getMemoryName(module,destMemory);
  sourceMemory_00 = getMemoryName(module,sourceMemory);
  pMVar1 = wasm::Builder::makeMemoryCopy
                     (&local_48,dest,local_38,local_40,destMemory_00,sourceMemory_00);
  return (BinaryenExpressionRef)pMVar1;
}

Assistant:

BinaryenExpressionRef BinaryenMemoryCopy(BinaryenModuleRef module,
                                         BinaryenExpressionRef dest,
                                         BinaryenExpressionRef source,
                                         BinaryenExpressionRef size,
                                         const char* destMemory,
                                         const char* sourceMemory) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeMemoryCopy((Expression*)dest,
                      (Expression*)source,
                      (Expression*)size,
                      getMemoryName(module, destMemory),
                      getMemoryName(module, sourceMemory)));
}